

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceGLImpl::CreateBuffer
          (RenderDeviceGLImpl *this,BufferDesc *BuffDesc,BufferData *pBuffData,IBuffer **ppBuffer,
          bool bIsDeviceInternal)

{
  anon_class_48_6_215cb50b ConstructObject;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  string msg;
  undefined1 local_71;
  undefined1 local_70 [16];
  BufferDesc *pBStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 *local_48;
  IBuffer ***pppIStack_40;
  BufferData *local_38;
  RefCntAutoPtr<Diligent::BufferGLImpl> local_30;
  IBuffer **local_28;
  
  local_71 = bIsDeviceInternal;
  local_38 = pBuffData;
  if ((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_70._0_8_ = (DeviceContextGLImpl *)0x0;
  }
  else {
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
              ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)local_70);
    if ((DeviceContextGLImpl *)local_70._0_8_ != (DeviceContextGLImpl *)0x0) goto LAB_00190624;
  }
  FormatString<char[44]>
            ((string *)(local_70 + 8),(char (*) [44])"Immediate device context has been destroyed");
  DebugAssertionFailed
            ((Char *)local_70._8_8_,"CreateBuffer",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x16a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._M_allocated_capacity + 1);
  }
LAB_00190624:
  local_30.m_pObject = (BufferGLImpl *)(local_70._0_8_ + 0x750);
  local_58._M_allocated_capacity = (size_type)&local_30;
  pppIStack_40 = &local_28;
  local_58._8_8_ = &local_38;
  local_48 = &local_71;
  ConstructObject.BuffDesc = BuffDesc;
  ConstructObject.this = &this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>;
  ConstructObject.ExtraArgs =
       (reference_wrapper<Diligent::GLContextState> *)local_58._M_allocated_capacity;
  ConstructObject._24_8_ = local_58._8_8_;
  ConstructObject._32_8_ = local_48;
  ConstructObject.ppBuffer = pppIStack_40;
  local_70._8_8_ = this;
  pBStack_60 = BuffDesc;
  local_28 = ppBuffer;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateDeviceObject<Diligent::IBuffer,Diligent::BufferDesc,Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateBufferImpl<std::reference_wrapper<Diligent::GLContextState>,Diligent::BufferData_const*,bool>(Diligent::IBuffer**,Diligent::BufferDesc_const&,std::reference_wrapper<Diligent::GLContextState>const&,Diligent::BufferData_const*const&,bool_const&)::_lambda()_1_>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,"Buffer",BuffDesc,ppBuffer,
             ConstructObject);
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)local_70);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateBuffer(const BufferDesc& BuffDesc, const BufferData* pBuffData, IBuffer** ppBuffer, bool bIsDeviceInternal)
{
    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    CreateBufferImpl(ppBuffer, BuffDesc, std::ref(pDeviceContext->GetContextState()), pBuffData, bIsDeviceInternal);
}